

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MulticastSocket.cpp
# Opt level: O2

bool __thiscall asl::MulticastSocket_::leave(MulticastSocket_ *this,InetAddress *a,int interfac)

{
  uchar *puVar1;
  undefined1 uVar2;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ipv6_mreq mr;
  long lVar3;
  
  if (*(int *)(this + 0x18) == 2) {
    puVar1 = (a->_data)._a;
    mr.ipv6mr_multiaddr.__in6_u._0_8_ = *(undefined8 *)(puVar1 + 8);
    mr.ipv6mr_multiaddr.__in6_u._8_8_ = *(undefined8 *)(puVar1 + 0x10);
    lVar3 = *(long *)this;
    uVar5 = 0x29;
    uVar4 = 0x15;
    uVar6 = 0x14;
    mr.ipv6mr_interface = interfac;
  }
  else {
    mr.ipv6mr_multiaddr.__in6_u.__u6_addr32[1] = interfac;
    mr.ipv6mr_multiaddr.__in6_u.__u6_addr32[0] = *(undefined4 *)((a->_data)._a + 4);
    lVar3 = *(long *)this;
    uVar4 = 0x24;
    uVar6 = 8;
    uVar5 = 0;
  }
  uVar2 = (**(code **)(lVar3 + 0x18))(this,uVar5,uVar4,&mr,uVar6);
  return (bool)uVar2;
}

Assistant:

bool MulticastSocket_::leave(const InetAddress& a, int interfac)
{
	if (_family == InetAddress::IPv6)
	{
		ipv6_mreq mr;
		mr.ipv6mr_multiaddr = ((sockaddr_in6*)a.ptr())->sin6_addr;
		mr.ipv6mr_interface = interfac;
		return setOption(IPPROTO_IPV6, IPV6_DROP_MEMBERSHIP, mr);
	}
	else
	{
		ip_mreq mr;
	mr.imr_multiaddr = ((sockaddr_in*)a.ptr())->sin_addr;
		mr.imr_interface.s_addr = interfac;
	return setOption(IPPROTO_IP, IP_DROP_MEMBERSHIP, mr); // seems to fail on WSL !!
}
}